

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Homogeneous.h
# Opt level: O2

void __thiscall
Eigen::internal::
homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
::evalTo<Eigen::Matrix<float,4,1,0,4,1>>
          (homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,4,0,4,4>>
           *this,Matrix<float,_4,_1,_0,_4,_1> *dst)

{
  VectorwiseOp<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>
  local_b8;
  Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
  local_88;
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true> local_50;
  
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>::Block
            ((Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false> *)&local_b8,
             *(Matrix<float,_4,_4,_0,_4,_4> **)this,0,0,4,3);
  local_88.m_rhs = *(RhsNested *)(this + 8);
  local_88.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_startCol.
  m_value = local_b8.m_matrix.
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
            m_startCol.m_value;
  local_88.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_outerStride
       = local_b8.m_matrix.
         super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
         m_outerStride;
  local_88.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_xpr =
       local_b8.m_matrix.
       super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr;
  local_88.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_startRow.
  m_value = local_b8.m_matrix.
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
            m_startRow.m_value;
  local_88.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.m_data =
       local_b8.m_matrix.
       super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data;
  local_88.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>._8_8_ =
       local_b8.m_matrix.
       super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>._8_8_;
  call_assignment<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Product<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,3,false>,Eigen::Matrix<float,3,1,0,3,1>,0>>
            (dst,&local_88);
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>::Block
            (&local_50,*(Matrix<float,_4,_4,_0,_4,_4> **)this,3);
  local_b8.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_startCol.
  m_value = local_50.
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
            m_startCol.m_value;
  local_b8.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_outerStride =
       local_50.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
       .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
       m_outerStride;
  local_b8.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr =
       local_50.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
       .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr;
  local_b8.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_startRow.
  m_value = local_50.
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
            m_startRow.m_value;
  local_b8.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data =
       local_50.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
       .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data;
  local_b8.m_matrix.
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>._8_8_ =
       local_50.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>
       .super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>._8_8_;
  VectorwiseOp<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>::
  replicate<1>((Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>
                *)&local_88,&local_b8,1);
  MatrixBase<Eigen::Matrix<float,4,1,0,4,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<float,4,1,0,4,1>> *)dst,
             (MatrixBase<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>
              *)&local_88);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC void evalTo(Dest& dst) const
  {
    // FIXME investigate how to allow lazy evaluation of this product when possible
    dst = Block<const LhsMatrixTypeNested,
              LhsMatrixTypeNested::RowsAtCompileTime,
              LhsMatrixTypeNested::ColsAtCompileTime==Dynamic?Dynamic:LhsMatrixTypeNested::ColsAtCompileTime-1>
            (m_lhs,0,0,m_lhs.rows(),m_lhs.cols()-1) * m_rhs;
    dst += m_lhs.col(m_lhs.cols()-1).rowwise()
            .template replicate<MatrixType::ColsAtCompileTime>(m_rhs.cols());
  }